

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::LinkedModel::MergeFrom(LinkedModel *this,LinkedModel *from)

{
  void *pvVar1;
  LogMessage *other;
  LinkedModelFile *this_00;
  LinkedModelFile *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/LinkedModel.pb.cc"
               ,0x106);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if (from->_oneof_case_[0] != 1) {
    return;
  }
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->LinkType_).linkedmodelfile_;
  }
  else {
    this->_oneof_case_[0] = 1;
    this_00 = (LinkedModelFile *)operator_new(0x28);
    LinkedModelFile::LinkedModelFile(this_00);
    (this->LinkType_).linkedmodelfile_ = this_00;
    if (from->_oneof_case_[0] != 1) {
      protobuf_LinkedModel_2eproto::InitDefaults();
      from_00 = (LinkedModelFile *)&_LinkedModelFile_default_instance_;
      goto LAB_005110f3;
    }
  }
  from_00 = (from->LinkType_).linkedmodelfile_;
LAB_005110f3:
  LinkedModelFile::MergeFrom(this_00,from_00);
  return;
}

Assistant:

void LinkedModel::MergeFrom(const LinkedModel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LinkedModel)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.LinkType_case()) {
    case kLinkedModelFile: {
      mutable_linkedmodelfile()->::CoreML::Specification::LinkedModelFile::MergeFrom(from.linkedmodelfile());
      break;
    }
    case LINKTYPE_NOT_SET: {
      break;
    }
  }
}